

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readskel.c
# Opt level: O3

void read_skel(char *name)

{
  bool bVar1;
  bool bVar2;
  char **ppcVar3;
  int iVar4;
  FILE *__stream;
  char *pcVar5;
  size_t sVar6;
  long lVar7;
  ushort **ppuVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  char cVar13;
  section *psVar14;
  uint uVar15;
  char buf [256];
  char local_138 [264];
  
  __stream = fopen(name,"r");
  if (__stream == (FILE *)0x0) {
    open_error(name);
  }
  uVar11 = 0xfffffffe;
  uVar15 = 0;
  bVar2 = true;
LAB_00117b84:
  do {
    while( true ) {
      do {
        pcVar5 = fgets(local_138,0xff,__stream);
        iVar4 = (int)uVar11;
        if (pcVar5 == (char *)0x0) {
          if (iVar4 < 0) {
            if (iVar4 == -2) {
              error(0,(char *)0x0,(char *)0x0,"No sections found in skeleton file \"%s\"",name);
            }
          }
          else {
            add_ptr((char *)0x0);
            ppcVar3 = ap_start;
            ap_start = ap;
            section_list[uVar11].ptr = ppcVar3;
          }
          return;
        }
        uVar15 = uVar15 + bVar2;
        sVar6 = strlen(local_138);
      } while ((int)sVar6 == 0);
      lVar7 = sVar6 << 0x20;
      lVar9 = lVar7 + -0x100000000 >> 0x20;
      cVar13 = local_138[lVar9];
      if (cVar13 != '\n') {
        local_138[lVar7 >> 0x20] = '\\';
        lVar9 = lVar7 + 0x100000000 >> 0x20;
      }
      bVar1 = cVar13 == '\n';
      local_138[lVar9] = '\0';
      if (((bVar2) && (local_138[0] == '%')) && (local_138[1] == '%')) break;
      bVar2 = bVar1;
      if (-1 < iVar4) {
        add_string(local_138);
      }
    }
    if (-1 < iVar4) {
      add_ptr((char *)0x0);
      ppcVar3 = ap_start;
      ap_start = ap;
      section_list[uVar11].ptr = ppcVar3;
    }
    cVar13 = local_138[2];
    ppuVar8 = __ctype_b_loc();
    if (cVar13 == '\0') {
      cVar13 = '\0';
      pcVar5 = local_138 + 2;
    }
    else {
      pcVar5 = local_138 + 2;
      do {
        if ((*(byte *)((long)*ppuVar8 + (long)cVar13 * 2 + 1) & 0x20) == 0) goto LAB_00117ca7;
        cVar13 = pcVar5[1];
        pcVar5 = pcVar5 + 1;
      } while (cVar13 != '\0');
      cVar13 = '\0';
    }
LAB_00117ca7:
    uVar11 = 0xffffffff;
    pcVar10 = pcVar5;
    if ((*(byte *)((long)*ppuVar8 + (long)cVar13 * 2 + 1) & 4) == 0) {
LAB_00117d33:
      bVar2 = bVar1;
      if (cVar13 != '\0') {
        error(0,local_138,pcVar5,"line %d of \"%s\", bad section name",(ulong)uVar15,name);
      }
      goto LAB_00117b84;
    }
    do {
      pcVar10 = pcVar10 + 1;
    } while (((*ppuVar8)[*pcVar10] & 8) != 0);
    *pcVar10 = '\0';
    if (section_list[0].name == (char *)0x0) {
      uVar11 = 0xffffffff;
LAB_00117d30:
      cVar13 = *pcVar5;
      goto LAB_00117d33;
    }
    psVar14 = section_list;
    uVar11 = 0xffffffff;
    uVar12 = 0;
    pcVar10 = section_list[0].name;
    do {
      psVar14 = psVar14 + 1;
      iVar4 = strcmp(pcVar10,pcVar5);
      if (iVar4 == 0) {
        uVar11 = uVar12;
      }
      pcVar10 = psVar14->name;
      uVar12 = (ulong)((int)uVar12 + 1);
    } while (pcVar10 != (char *)0x0);
    if ((int)uVar11 < 0) goto LAB_00117d30;
    add_fmt((char *)0x0,(ulong)(uVar15 + 1),name);
    bVar2 = bVar1;
  } while( true );
}

Assistant:

void read_skel(char *name)
{
char	buf[256];
int	section = -2;
int	line = 0, sline = 1, eline = 1;
int	i;
FILE	*fp;

    if (!(fp = fopen(name, "r")))
	open_error(name);
    while(fgets(buf, 255, fp)) {
	if ((sline = eline))
	    line++;
	if ((i = strlen(buf)) == 0)
	    continue;
	if (buf[i-1] == '\n') {
	    buf[--i] = 0;
	    eline = 1;
	} else {
	    buf[i++] = '\\';
	    buf[i] = 0;
	    eline = 0;
	}
	if (sline && buf[0] == '%' && buf[1] == '%') {
	    char *p = buf+2;
	    if (section >= 0) {
	      section_list[section].ptr = fin_section();
	    }
	    section = -1;
	    while(*p && isspace(*p)) p++;
	    if (isalpha(*p)) {
	      char *e = p;
	      while(isalnum(*++e));
	      *e = 0;
	      for (i=0; section_list[i].name; i++)
		if (!strcmp(section_list[i].name, p))
		  section = i;
	    }
	    if (section >= 0)
	      add_fmt("#line %d \"%s\"", line+1, name);
	    else if (*p)
	      error(0, buf, p, "line %d of \"%s\", bad section name",
		    line, name);
        } else if (section >= 0) {
	    add_string(buf);
	}
    }
    if (section >= 0)
	section_list[section].ptr = fin_section();
    if (section == -2)
	error(0, 0, 0, "No sections found in skeleton file \"%s\"", name);
}